

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_message.c
# Opt level: O3

APP_PAYLOAD * mqttmessage_getApplicationMsg(MQTT_MESSAGE_HANDLE handle)

{
  LOGGER_LOG p_Var1;
  APP_PAYLOAD *pAVar2;
  
  if (handle == (MQTT_MESSAGE_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 == (LOGGER_LOG)0x0) {
      pAVar2 = (APP_PAYLOAD *)0x0;
    }
    else {
      pAVar2 = (APP_PAYLOAD *)0x0;
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/umqtt/src/mqtt_message.c"
                ,"mqttmessage_getApplicationMsg",0x164,1,"Invalid Parameter handle: %p.",0);
    }
  }
  else if ((handle->const_payload).length == 0) {
    pAVar2 = &handle->appPayload;
  }
  else {
    pAVar2 = &handle->const_payload;
  }
  return pAVar2;
}

Assistant:

const APP_PAYLOAD* mqttmessage_getApplicationMsg(MQTT_MESSAGE_HANDLE handle)
{
    const APP_PAYLOAD* result;
    if (handle == NULL)
    {
        /* Codes_SRS_MQTTMESSAGE_07_020: [If handle is NULL or if msgLen is 0 then mqttmessage_getApplicationMsg shall return NULL.] */
        LogError("Invalid Parameter handle: %p.", handle);
        result = NULL;
    }
    else
    {
        /* Codes_SRS_MQTTMESSAGE_07_021: [mqttmessage_getApplicationMsg shall return the applicationMsg value contained in MQTT_MESSAGE_HANDLE handle and the length of the appMsg in the msgLen parameter.] */
        if (handle->const_payload.length > 0)
        {
            result = &handle->const_payload;
        }
        else
        {
            result = &handle->appPayload;
        }
    }
    return result;
}